

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O3

FFSFile open_FFSfile(char *path,char *flags)

{
  void *fd;
  FFSFile p_Var1;
  char *pcVar2;
  int allow_output;
  int index;
  int raw;
  int allow_input;
  char msg [128];
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  char local_98 [128];
  
  local_9c = 0;
  local_a8 = 0;
  parse_flags(flags,&local_9c,&local_a8,&local_a0,&local_a4);
  if ((local_9c == 0) || (local_a8 == 0)) {
    if (local_9c == 0) {
      pcVar2 = "w";
    }
    else {
      pcVar2 = "r";
    }
    fd = (*ffs_file_open_func)(path,pcVar2,(int *)0x0,(int *)0x0);
  }
  else {
    fd = (*ffs_file_open_func)(path,"a",(int *)0x0,(int *)0x0);
    if (fd != (void *)0x0) goto LAB_00116a88;
    fd = (*ffs_file_open_func)(path,"w",(int *)0x0,(int *)0x0);
  }
  if (fd == (void *)0x0) {
    snprintf(local_98,0x80,"open_FFSfile failed for %s :",path);
    perror(local_98);
    return (FFSFile)0x0;
  }
LAB_00116a88:
  p_Var1 = open_FFSfd(fd,flags);
  return p_Var1;
}

Assistant:

extern FFSFile
open_FFSfile(const char *path, const char *flags)
{
    void *file;
    FFSFile f;
    int allow_input = 0, allow_output = 0;
    int raw, index;

    parse_flags(flags, &allow_input, &allow_output, &raw, &index);

    if (allow_input && allow_output) {
	file = (FFSFile) (ffs_file_open_func)(path, "a", NULL, NULL);
	if (file == (void*)0) {
	    /* if open for append failed, try creating it */
	    file = (FFSFile)(ffs_file_open_func)(path, "w", NULL, NULL);
	}
    } else if (allow_input) {
	file = (FFSFile)(ffs_file_open_func)(path, "r", NULL, NULL);
    } else {
	file = (FFSFile)(ffs_file_open_func)(path, "w", NULL, NULL);
    }

    if (file == NULL) {
	char msg[128];
	(void) snprintf(msg, sizeof(msg), "open_FFSfile failed for %s :", path);
	perror(msg);
	return NULL;
    }
    f = open_FFSfd(file, flags);
    return f;
}